

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesDeviceGetState(zes_device_handle_t hDevice,zes_device_state_t *pState)

{
  zes_pfnDeviceGetState_t pfnGetState;
  ze_result_t result;
  zes_device_state_t *pState_local;
  zes_device_handle_t hDevice_local;
  
  pfnGetState._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c9c8 != (code *)0x0) {
    pfnGetState._4_4_ = (*DAT_0011c9c8)(hDevice,pState);
  }
  return pfnGetState._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceGetState(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        zes_device_state_t* pState                      ///< [in,out] Structure that will contain information about the device.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetState = context.zesDdiTable.Device.pfnGetState;
        if( nullptr != pfnGetState )
        {
            result = pfnGetState( hDevice, pState );
        }
        else
        {
            // generic implementation
        }

        return result;
    }